

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O1

AggregateKernelConfig *
anon_unknown.dwarf_ad097::PercentTotalKernel::Config::create
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *cfg)

{
  pointer pbVar1;
  pointer pcVar2;
  AggregateKernelConfig *pAVar3;
  
  pAVar3 = (AggregateKernelConfig *)operator_new(0x78);
  pAVar3->_vptr_AggregateKernelConfig = (_func_int **)&PTR__Config_0027a050;
  pbVar1 = (cfg->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pAVar3[1]._vptr_AggregateKernelConfig = (_func_int **)(pAVar3 + 3);
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pAVar3 + 1),pcVar2,pcVar2 + pbVar1->_M_string_length);
  *(undefined8 *)((long)&pAVar3[0xc]._vptr_AggregateKernelConfig + 1) = 0;
  *(undefined8 *)((long)&pAVar3[0xd]._vptr_AggregateKernelConfig + 1) = 0;
  pAVar3[0xb]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  pAVar3[0xc]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  pAVar3[9]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  pAVar3[10]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  pAVar3[7]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  pAVar3[8]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  pAVar3[5]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  pAVar3[6]._vptr_AggregateKernelConfig = (_func_int **)0x0;
  return pAVar3;
}

Assistant:

static AggregateKernelConfig* create(const std::vector<std::string>& cfg) { return new Config(cfg, false); }